

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileMapping.cpp
# Opt level: O3

FileMapping * __thiscall pbrt::syntactic::FileMapping::operator=(FileMapping *this,FileMapping *fm)

{
  this->mapping = fm->mapping;
  this->num_bytes = fm->num_bytes;
  this->file = fm->file;
  fm->mapping = (void *)0x0;
  fm->num_bytes = 0;
  fm->file = -1;
  return this;
}

Assistant:

FileMapping& FileMapping::operator=(FileMapping &&fm) {
	  mapping = fm.mapping;
	  num_bytes = fm.num_bytes;
	  file = fm.file;
#ifdef _WIN32
	  mapping_handle = fm.mapping_handle;
#endif

	  fm.mapping = nullptr;
	  fm.num_bytes = 0;
#ifdef _WIN32
	  fm.file = INVALID_HANDLE_VALUE;
	  fm.mapping_handle = INVALID_HANDLE_VALUE;
#else
	  fm.file = -1;
#endif

	  return *this;
    }